

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryManager.cpp
# Opt level: O0

void __thiscall Lodtalk::GarbageCollector::unregisterGCRoot(GarbageCollector *this,Oop *gcroot)

{
  ulong uVar1;
  size_type sVar2;
  reference pvVar3;
  __normal_iterator<std::pair<Lodtalk::Oop_*,_unsigned_long>_*,_std::vector<std::pair<Lodtalk::Oop_*,_unsigned_long>,_std::allocator<std::pair<Lodtalk::Oop_*,_unsigned_long>_>_>_>
  local_48;
  __normal_iterator<std::pair<Lodtalk::Oop_*,_unsigned_long>_*,_std::vector<std::pair<Lodtalk::Oop_*,_unsigned_long>,_std::allocator<std::pair<Lodtalk::Oop_*,_unsigned_long>_>_>_>
  local_40;
  const_iterator local_38;
  ulong local_30;
  size_t i;
  unique_lock<std::mutex> l;
  Oop *gcroot_local;
  GarbageCollector *this_local;
  
  l._8_8_ = gcroot;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)&i,&this->controlMutex);
  local_30 = 0;
  while( true ) {
    uVar1 = local_30;
    sVar2 = std::
            vector<std::pair<Lodtalk::Oop_*,_unsigned_long>,_std::allocator<std::pair<Lodtalk::Oop_*,_unsigned_long>_>_>
            ::size(&this->rootPointers);
    if (sVar2 <= uVar1) break;
    pvVar3 = std::
             vector<std::pair<Lodtalk::Oop_*,_unsigned_long>,_std::allocator<std::pair<Lodtalk::Oop_*,_unsigned_long>_>_>
             ::operator[](&this->rootPointers,local_30);
    if (pvVar3->first == (Oop *)l._8_8_) {
      local_48._M_current =
           (pair<Lodtalk::Oop_*,_unsigned_long> *)
           std::
           vector<std::pair<Lodtalk::Oop_*,_unsigned_long>,_std::allocator<std::pair<Lodtalk::Oop_*,_unsigned_long>_>_>
           ::begin(&this->rootPointers);
      local_40 = __gnu_cxx::
                 __normal_iterator<std::pair<Lodtalk::Oop_*,_unsigned_long>_*,_std::vector<std::pair<Lodtalk::Oop_*,_unsigned_long>,_std::allocator<std::pair<Lodtalk::Oop_*,_unsigned_long>_>_>_>
                 ::operator+(&local_48,local_30);
      __gnu_cxx::
      __normal_iterator<std::pair<Lodtalk::Oop*,unsigned_long>const*,std::vector<std::pair<Lodtalk::Oop*,unsigned_long>,std::allocator<std::pair<Lodtalk::Oop*,unsigned_long>>>>
      ::__normal_iterator<std::pair<Lodtalk::Oop*,unsigned_long>*>
                ((__normal_iterator<std::pair<Lodtalk::Oop*,unsigned_long>const*,std::vector<std::pair<Lodtalk::Oop*,unsigned_long>,std::allocator<std::pair<Lodtalk::Oop*,unsigned_long>>>>
                  *)&local_38,&local_40);
      std::
      vector<std::pair<Lodtalk::Oop_*,_unsigned_long>,_std::allocator<std::pair<Lodtalk::Oop_*,_unsigned_long>_>_>
      ::erase(&this->rootPointers,local_38);
    }
    local_30 = local_30 + 1;
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&i);
  return;
}

Assistant:

void GarbageCollector::unregisterGCRoot(Oop *gcroot)
{
	std::unique_lock<std::mutex> l(controlMutex);
	for(size_t i = 0; i < rootPointers.size(); ++i)
	{
		if(rootPointers[i].first == gcroot)
			rootPointers.erase(rootPointers.begin() + i);
	}
}